

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

wchar_t get_use_device_chance(object *obj)

{
  int iVar1;
  int local_30;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t skill;
  wchar_t x;
  wchar_t fail;
  wchar_t lev;
  object *obj_local;
  
  if ((player->state).skills[2] < L'\n') {
    local_24 = L'\n';
  }
  else {
    local_24 = (player->state).skills[2];
  }
  if (local_24 < L'\x97') {
    if ((player->state).skills[2] < L'\n') {
      local_2c = L'\n';
    }
    else {
      local_2c = (player->state).skills[2];
    }
    local_28 = local_2c;
  }
  else {
    local_28 = L'\x96';
  }
  if (obj->artifact == (artifact *)0x0) {
    x = obj->kind->level;
  }
  else {
    x = obj->artifact->level;
  }
  local_30 = (local_28 - x) * 2 + 1;
  iVar1 = local_30 * -0x172;
  if (local_30 < 0) {
    local_30 = -local_30;
  }
  return iVar1 / (local_30 + 5) + L'ż';
}

Assistant:

int get_use_device_chance(const struct object *obj)
{
	int lev, fail, x;
	int skill = MIN(MAX(player->state.skills[SKILL_DEVICE], 10), 150);

	/* Extract the item level, which is the difficulty rating */
	if (obj->artifact)
		lev = obj->artifact->level;
	else
		lev = obj->kind->level;

	/* Calculate x */
	x = 2 * (skill - lev) + 1;

	/* Now calculate the failure rate */
	fail = -370 * x;
	fail /= (5 + ABS(x));
	fail += 380;

	return fail;
}